

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void uavs3d_if_hor_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < height) {
    iVar1 = 0;
    do {
      if (0 < width) {
        uVar3 = 0;
        do {
          iVar2 = (int)((int)coeff[7] * (uint)src[uVar3 + 4] +
                        (int)coeff[6] * (uint)src[uVar3 + 3] +
                        (int)coeff[5] * (uint)src[uVar3 + 2] + (int)coeff[4] * (uint)src[uVar3 + 1]
                        + (int)coeff[3] * (uint)src[uVar3] + (int)coeff[2] * (uint)src[uVar3 - 1] +
                          (int)coeff[1] * (uint)src[uVar3 - 2] + (int)*coeff * (uint)src[uVar3 - 3]
                       + 0x20) >> 6;
          if (max_val <= iVar2) {
            iVar2 = max_val;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          dst[uVar3] = (pel)iVar2;
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      src = src + i_src;
      dst = dst + i_dst;
      iVar1 = iVar1 + 1;
    } while (iVar1 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_HOR(src, col, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}